

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::MSAACompression(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  undefined1 *puVar1;
  uint uVar2;
  uint32_t uVar3;
  GMM_STATUS GVar4;
  GMM_RESOURCE_FORMAT GVar5;
  
  uVar2 = (pTexInfo->MSAA).NumSamples - 2;
  if (uVar2 < 7) {
    uVar3 = *(uint32_t *)(&DAT_001bcbdc + (ulong)uVar2 * 4);
    GVar5 = *(GMM_RESOURCE_FORMAT *)(&DAT_001bcbf8 + (ulong)uVar2 * 4);
  }
  else {
    GVar5 = GMM_FORMAT_GENERIC_64BIT;
    uVar3 = 0x40;
  }
  pTexInfo->BitsPerPixel = uVar3;
  pTexInfo->Format = GVar5;
  GVar4 = __GmmTexFillHAlignVAlign(pTexInfo,this->pGmmLibContext);
  if (GVar4 == GMM_SUCCESS) {
    (pTexInfo->MSAA).NumSamples = 1;
    puVar1 = &(pTexInfo->Flags).Gpu.field_0x5;
    *puVar1 = *puVar1 | 4;
  }
  return GVar4;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::MSAACompression(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_STATUS Status = GMM_SUCCESS;

    if((pTexInfo->MSAA.NumSamples == 2) || (pTexInfo->MSAA.NumSamples == 4))
    {
        pTexInfo->BitsPerPixel = 8;
        pTexInfo->Format       = GMM_FORMAT_R8_UINT;
    }
    else if(pTexInfo->MSAA.NumSamples == 8)
    {
        pTexInfo->BitsPerPixel = 32;
        pTexInfo->Format       = GMM_FORMAT_R32_UINT;
    }
    else //if(pTexInfo->MSAA.NumSamples == 16)
    {
        pTexInfo->BitsPerPixel = 64;
        pTexInfo->Format       = GMM_FORMAT_GENERIC_64BIT;
    }

    if((Status = __GmmTexFillHAlignVAlign(pTexInfo, pGmmLibContext)) != GMM_SUCCESS) // Need to get our alignment (matching RT) before overwriting our RT's MSAA setting.
    {
        return Status;
    }
    pTexInfo->MSAA.NumSamples         = 1; // CCS itself isn't MSAA'ed.
    pTexInfo->Flags.Gpu.__MsaaTileMcs = 1;

    return Status;
}